

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O3

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  pointer pFVar1;
  pointer pSVar2;
  pointer pFVar3;
  pointer pBVar4;
  Body *pBVar5;
  ulong uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  SrcEvaluatorType srcEvaluator_1;
  ulong uVar13;
  Matrix3d *pMVar14;
  SpatialTransform *pSVar15;
  SpatialTransform *pSVar16;
  char *pcVar17;
  Matrix3d *pMVar18;
  SpatialTransform *pSVar19;
  undefined8 *puVar20;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator_2;
  byte bVar21;
  Body parent_body;
  FixedBody fbody;
  Body local_2f0;
  SpatialTransform local_280;
  undefined8 local_220 [9];
  undefined8 local_1d8;
  double dStack_1d0;
  double local_1c8;
  SpatialTransform local_1c0;
  value_type local_160;
  
  bVar21 = 0;
  uVar6 = (ulong)parent_id;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_160.mMass = body->mMass;
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  uVar11 = (ulong)(parent_id - model->fixed_body_discriminator);
  local_160.mMovableParent = parent_id;
  if ((parent_id != 0xffffffff && model->fixed_body_discriminator <= parent_id) &&
     (pFVar1 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar13 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) *
              -0x79435e50d79435e5, uVar11 <= uVar13 && uVar13 - uVar11 != 0)) {
    pFVar3 = pFVar1 + uVar11;
    local_2f0.mMass = pFVar3->mMass;
    local_2f0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar3->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_2f0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 8);
    local_2f0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 0x10);
    pMVar14 = &pFVar3->mInertia;
    pMVar18 = &local_2f0.mInertia;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar14->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar14 = (Matrix3d *)
                ((long)&(pMVar14->super_Matrix3d).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> + 8);
      pMVar18 = (Matrix3d *)
                ((pMVar18->super_Matrix3d).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                + 1);
    }
    local_2f0._104_4_ = pFVar3->mMovableParent;
    uVar6 = (ulong)(uint)local_2f0._104_4_;
    pSVar16 = &pFVar1[uVar11].mParentTransform;
    pSVar15 = pSVar16;
    pSVar19 = &local_280;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar15->E;
      pSVar15 = (SpatialTransform *)((long)&pSVar15->E + 8);
      pSVar19 = (SpatialTransform *)
                ((pSVar19->E).super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                + 1);
    }
    local_280.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pSVar16->r + 0x10);
    local_280.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = *(double *)&(pSVar16->r).super_Vector3d;
    local_280.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = *(double *)((long)&pSVar16->r + 8);
    pSVar15 = &pFVar1[uVar11].mBaseTransform;
    puVar20 = local_220;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar20 = *(undefined8 *)&pSVar15->E;
      pSVar15 = (SpatialTransform *)((long)&pSVar15->E + 8);
      puVar20 = puVar20 + 1;
    }
    local_1c8 = *(double *)((long)(pSVar16 + 1) + 0x58);
    local_1d8 = *(undefined8 *)&((Vector3d *)((long)(pSVar16 + 1) + 0x48))->super_Vector3d;
    dStack_1d0 = *(double *)((long)(pSVar16 + 1) + 0x50);
    local_160.mMovableParent = local_2f0._104_4_;
    RigidBodyDynamics::Math::SpatialTransform::operator*(&local_1c0,joint_frame,&local_280);
    pSVar16 = &local_1c0;
    pSVar15 = &local_160.mParentTransform;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pSVar15->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (pSVar16->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar16 = (SpatialTransform *)((long)pSVar16 + (ulong)bVar21 * -0x10 + 8);
      pSVar15 = (SpatialTransform *)((long)pSVar15 + (ulong)bVar21 * -0x10 + 8);
    }
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_1c0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_1c0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_1c0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
  }
  pBVar4 = (model->mBodies).
           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           .
           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar6;
  local_2f0.mMass = pBVar4->mMass;
  local_2f0.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(pBVar4->mCenterOfMass).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
  local_2f0.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)((long)&(pBVar4->mCenterOfMass).super_Vector3d + 8);
  local_2f0.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)((long)&(pBVar4->mCenterOfMass).super_Vector3d + 0x10);
  pMVar14 = &pBVar4->mInertia;
  pMVar18 = &local_2f0.mInertia;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[0] =
         *(double *)
          &(pMVar14->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
    pMVar14 = (Matrix3d *)((long)pMVar14 + ((ulong)bVar21 * -2 + 1) * 8);
    pMVar18 = (Matrix3d *)((long)pMVar18 + ((ulong)bVar21 * -2 + 1) * 8);
  }
  local_2f0.mIsVirtual = pBVar4->mIsVirtual;
  RigidBodyDynamics::Body::Join(&local_2f0,&local_160.mParentTransform,body);
  pBVar5 = (model->mBodies).
           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           .
           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           ._M_impl.super__Vector_impl_data._M_start + local_160.mMovableParent;
  if (pBVar5 != &local_2f0) {
    pBVar5->mMass = local_2f0.mMass;
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
    (pBVar5->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] =
         local_2f0.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
    (pBVar5->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_2f0.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    (pBVar5->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_2f0.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (pBVar5->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_2f0.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pBVar5->mIsVirtual = local_2f0.mIsVirtual;
  }
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            ((SpatialRigidBodyInertia *)&local_1c0,local_2f0.mMass,&local_2f0.mCenterOfMass,
             &local_2f0.mInertia);
  uVar6 = (ulong)local_160.mMovableParent;
  pSVar2 = (model->I).
           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2[uVar6].m =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)&pSVar2[uVar6].h.super_Vector3d =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 8) =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 0x10) =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  pSVar2[uVar6].Ixx =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  (&pSVar2[uVar6].Ixx)[1] =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  pSVar2[uVar6].Iyy =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  (&pSVar2[uVar6].Iyy)[1] =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  pSVar2[uVar6].Izy =
       local_1c0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  (&pSVar2[uVar6].Izy)[1] =
       local_1c0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(&(model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ,&local_160);
  uVar6 = ((long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
  uVar10 = model->fixed_body_discriminator;
  if (uVar6 < ~uVar10 || uVar6 - ~uVar10 == 0) {
    if (body_name->_M_string_length != 0) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(&(model->mBodyNameMap)._M_t,body_name);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(model->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Body with name \'",0x17);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(body_name->_M_dataplus)._M_p,
                            body_name->_M_string_length);
        pcVar17 = "\' already exists!";
        lVar12 = 0x11;
        goto LAB_00139eac;
      }
      pFVar1 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar3 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = model->fixed_body_discriminator;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&model->mBodyNameMap,body_name);
      *pmVar8 = (uVar10 + (int)((ulong)((long)pFVar1 - (long)pFVar3) >> 4) * 0x286bca1b) - 1;
      uVar10 = model->fixed_body_discriminator;
      uVar6 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
    }
    return ((int)uVar6 + uVar10) - 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: cannot add more than ",0x1c);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  pcVar17 = " fixed bodies. You need to modify Model::fixed_body_discriminator for this.";
  lVar12 = 0x4b;
LAB_00139eac:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,lVar12);
  std::endl<char,std::char_traits<char>>(poVar9);
  abort();
}

Assistant:

unsigned int AddBodyFixedJoint (
		Model &model,
		const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	FixedBody fbody = FixedBody::CreateFromBody (body);
	fbody.mMovableParent = parent_id;
	fbody.mParentTransform = joint_frame;

	if (model.IsFixedBodyId(parent_id)) {
		FixedBody fixed_parent = model.mFixedBodies[parent_id - model.fixed_body_discriminator];

		fbody.mMovableParent = fixed_parent.mMovableParent;
		fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
	}

	// merge the two bodies
	Body parent_body = model.mBodies[fbody.mMovableParent];
	parent_body.Join (fbody.mParentTransform, body);
	model.mBodies[fbody.mMovableParent] = parent_body;
	model.I[fbody.mMovableParent] = SpatialRigidBodyInertia::createFromMassComInertiaC (parent_body.mMass, parent_body.mCenterOfMass, parent_body.mInertia);

	model.mFixedBodies.push_back (fbody);

	if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() - model.fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size() << " fixed bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}

	if (body_name.size() != 0) {
		if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		model.mBodyNameMap[body_name] = model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
	}

	return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}